

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

bool ON_ClassId::PurgeAfter(ON_ClassId *pClassId)

{
  ON_ClassId **ppOVar1;
  
  ppOVar1 = &m_p0;
  do {
    ppOVar1 = &((ON_ClassId *)ppOVar1)->m_pNext->m_pNext;
    if ((ON_ClassId *)ppOVar1 == (ON_ClassId *)0x0) goto LAB_0055a9bf;
  } while ((ON_ClassId *)ppOVar1 != pClassId);
  ((ON_ClassId *)ppOVar1)->m_pNext = (ON_ClassId *)0x0;
  m_p1 = (ON_ClassId *)ppOVar1;
  if ((ON_ClassId *)ppOVar1 == (ON_ClassId *)0x0) {
LAB_0055a9bf:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
               ,0x28c,"","ON_ClassId::PurgeAfter pClassId is not active");
  }
  return (ON_ClassId *)ppOVar1 != (ON_ClassId *)0x0;
}

Assistant:

bool ON_ClassId::PurgeAfter(const ON_ClassId* pClassId)
{
  // If you crash in on the p=p->m_pNext iterator in
  // the for() loop, it is because somebody incorrectly
  // unloaded a dll that contains an ON_OBJECT_IMPLEMENT 
  // macro.
  for (ON_ClassId* p = m_p0; p; p = p->m_pNext)
  {
    if (pClassId == p)
    {
      // All class ids after pClassId are assumed to
      // be bad.
      p->m_pNext = 0;
      m_p1 = p;
      return true;
    }
  }

  ON_ERROR("ON_ClassId::PurgeAfter pClassId is not active");
  return false;
}